

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<slang::SmallVector<int,_10UL>_>::reallocateTo
          (SmallVectorBase<slang::SmallVector<int,_10UL>_> *this,size_type newCapacity)

{
  SmallVector<int,_10UL> *__result;
  move_iterator<slang::SmallVector<int,_10UL>_*> __last;
  
  __result = (SmallVector<int,_10UL> *)operator_new(newCapacity << 6);
  __last._M_current = this->data_ + this->len;
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<slang::SmallVector<int,10ul>*>,slang::SmallVector<int,10ul>*>
            (this->data_,__last,__result);
  cleanup(this,(EVP_PKEY_CTX *)__last._M_current);
  this->cap = newCapacity;
  this->data_ = __result;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }